

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O1

StringList * __thiscall
Args::HelpPrinter::createUsageString
          (StringList *__return_storage_ptr__,HelpPrinter *this,ArgIface *arg,bool required)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined3 in_register_00000009;
  String usage;
  String local_50;
  QString local_38;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (String *)0x0;
  local_38.d.size = 0;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  if (CONCAT31(in_register_00000009,required) == 0) {
    String::String(&local_50,"[ ");
    QString::append(&local_38);
    if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
      }
    }
  }
  iVar1 = (*arg->_vptr_ArgIface[7])(arg);
  if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x10) != 0) {
    String::String(&local_50,"-");
    QString::append(&local_38);
    if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    (*arg->_vptr_ArgIface[7])(arg);
    QString::append(&local_38);
    iVar1 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x10) != 0) {
      String::String(&local_50,",");
      QString::append(&local_38);
      if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
        }
      }
      QtPrivate::QGenericArrayOps<Args::String>::emplace<Args::String_const&>
                ((QGenericArrayOps<Args::String> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(String *)&local_38);
      String::clear((String *)&local_38);
    }
  }
  iVar1 = (*arg->_vptr_ArgIface[8])(arg);
  if (*(long *)(CONCAT44(extraout_var_01,iVar1) + 0x10) == 0) {
    iVar1 = (*arg->_vptr_ArgIface[7])(arg);
    if (*(long *)(CONCAT44(extraout_var_02,iVar1) + 0x10) == 0) {
      iVar1 = (*arg->_vptr_ArgIface[8])(arg);
      if (*(long *)(CONCAT44(extraout_var_03,iVar1) + 0x10) == 0) {
        (*arg->_vptr_ArgIface[3])(&local_50,arg);
        QString::append(&local_38);
        if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
          }
        }
      }
    }
  }
  else {
    String::String(&local_50,"--");
    QString::append(&local_38);
    if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    (*arg->_vptr_ArgIface[8])(arg);
    QString::append(&local_38);
  }
  iVar1 = (*arg->_vptr_ArgIface[4])(arg);
  if ((char)iVar1 != '\0') {
    String::String(&local_50," <");
    QString::append(&local_38);
    if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    (*arg->_vptr_ArgIface[9])(arg);
    QString::append(&local_38);
    String::String(&local_50,">");
    QString::append(&local_38);
    if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
      }
    }
  }
  if (!required) {
    String::String(&local_50," ]");
    QString::append(&local_38);
    if (&(local_50.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.m_str.d.d)->super_QArrayData,2,8);
      }
    }
  }
  QtPrivate::QGenericArrayOps<Args::String>::emplace<Args::String_const&>
            ((QGenericArrayOps<Args::String> *)__return_storage_ptr__,
             (__return_storage_ptr__->d).size,(String *)&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline StringList
HelpPrinter::createUsageString( ArgIface * arg, bool required ) const
{
	StringList result;

	String usage;

	if( !required )
		usage.append( SL( "[ " ) );

	if( !arg->flag().empty() )
	{
		usage.append( SL( "-" ) );
		usage.append( arg->flag() );

		if( !arg->argumentName().empty() )
		{
			usage.append( SL( "," ) );

			result.push_back( usage );

			usage.clear();
		}
	}

	if( !arg->argumentName().empty() )
	{
		usage.append( SL( "--" ) );
		usage.append( arg->argumentName() );
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
		usage.append( arg->name() );

	if( arg->isWithValue() )
	{
		usage.append( SL( " <" ) );
		usage.append( arg->valueSpecifier() );
		usage.append( SL( ">" ) );
	}

	if( !required )
		usage.append( SL( " ]" ) );

	result.push_back( usage );

	return result;
}